

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<unsigned_int>>
          (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>> *this,
          Canceler *params,Promise<unsigned_int> *params_1)

{
  Own<kj::_::PromiseNode> local_28;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)this = &PTR_onReady_0041d4a0;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_0041d4e8;
  this[0x18] = (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>)0x0;
  this[0x178] = (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>)0x0;
  this[0x180] = (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>)0x1;
  local_28.disposer = (params_1->super_PromiseBase).node.disposer;
  local_28.ptr = (params_1->super_PromiseBase).node.ptr;
  (params_1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  Canceler::AdapterImpl<unsigned_int>::AdapterImpl
            ((AdapterImpl<unsigned_int> *)(this + 0x188),
             (PromiseFulfiller<unsigned_int> *)(this + 0x10),params,
             (Promise<unsigned_int> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_28);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}